

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_convert(jit_State *J)

{
  NarrowIns *pNVar1;
  undefined4 uVar2;
  NarrowIns *pNVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  IRType IVar7;
  TRef TVar8;
  IRRef1 IVar9;
  IRType *pIVar10;
  IRType *pIVar11;
  IRRef IVar12;
  NarrowIns *pNVar13;
  undefined1 auVar14 [16];
  NarrowConv local_450;
  
  TVar8 = 0;
  if ((J->flags & 0x200000) != 0) {
    pNVar13 = local_450.stack;
    local_450.maxsp = local_450.stack + 0xfc;
    local_450.t = (J->fold).ins.field_1.t.irt & IRT_TYPE;
    local_450.mode = 0;
    if ((J->fold).ins.field_1.o != '\\') {
      local_450.mode = (IRRef)(J->fold).ins.field_0.op2;
    }
    local_450.J = J;
    local_450.sp = pNVar13;
    iVar5 = narrow_conv_backprop(&local_450,(uint)(J->fold).ins.field_0.op1,0);
    pNVar3 = local_450.sp;
    TVar8 = 0;
    if ((iVar5 < 2) && (TVar8 = local_450.stack[0], pNVar13 < local_450.sp)) {
      uVar2 = *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2);
      uVar4 = (short)(char)((uint)uVar2 >> 0x10) & 0xc80;
      pIVar10 = pNVar13;
      do {
        pNVar1 = pNVar13 + 1;
        IVar7 = *pNVar13;
        if (IVar7 < 0x10000) {
          *pIVar10 = IVar7;
LAB_0011d1f5:
          pIVar11 = pIVar10 + 1;
          pNVar13 = pNVar1;
        }
        else {
          uVar6 = IVar7 >> 0x10;
          if (uVar6 == 3) {
            if (local_450.t == IRT_I64) {
              IVar7 = lj_ir_kint64(J,(long)(int)*pNVar1);
            }
            else {
              IVar7 = lj_ir_kint(J,*pNVar1);
            }
            *pIVar10 = IVar7;
            pIVar11 = pIVar10 + 1;
            pNVar13 = pNVar13 + 2;
          }
          else if (uVar6 == 2) {
            (J->fold).ins.field_0.op1 = (short)pIVar10[-1];
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b150ab3;
            IVar7 = lj_opt_fold(J);
            pIVar10[-1] = IVar7;
            pIVar11 = pIVar10;
            pNVar13 = pNVar1;
          }
          else {
            IVar9 = (IRRef1)IVar7;
            if (uVar6 == 1) {
              (J->fold).ins.field_0.op1 = IVar9;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar2;
              IVar7 = lj_ir_emit(J);
              *pIVar10 = IVar7;
              goto LAB_0011d1f5;
            }
            pIVar11 = pIVar10 + -1;
            IVar12 = local_450.mode;
            if ((local_450.mode & 0xf000) == 0x2000) {
              if (((pNVar1 == pNVar3) && (-1 < (short)*pIVar11)) &&
                 (-1 < (int)((J->cur).ir[*pIVar11 & 0x7fff].field_1.op12 + 0x40000000))) {
                uVar4 = 0;
              }
              else {
                IVar12 = local_450.mode | 0x1000;
              }
            }
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)(pIVar10 + -2);
            auVar14 = pshuflw(auVar14,auVar14,0xe8);
            (J->fold).ins.field_0.ot = (short)(IVar7 >> 0x10) + uVar4;
            (J->fold).ins.field_1.op12 = auVar14._0_4_;
            TVar8 = lj_opt_fold(J);
            pIVar10[-2] = TVar8;
            pNVar13 = pNVar1;
            if (IVar9 != 0) {
              uVar6 = J->bpropslot;
              J->bpropslot = uVar6 + 1 & 0xf;
              J->bpropcache[uVar6].key = IVar9;
              J->bpropcache[uVar6].val = (IRRef1)TVar8;
              J->bpropcache[uVar6].mode = IVar12;
            }
          }
        }
        pIVar10 = pIVar11;
        TVar8 = local_450.stack[0];
      } while (pNVar13 < pNVar3);
    }
  }
  return TVar8;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_convert(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_NARROW)) {
    NarrowConv nc;
    nc.J = J;
    nc.sp = nc.stack;
    nc.maxsp = &nc.stack[NARROW_MAX_STACK-4];
    nc.t = irt_type(fins->t);
    if (fins->o == IR_TOBIT) {
      nc.mode = IRCONV_TOBIT;  /* Used only in the backpropagation cache. */
    } else {
      nc.mode = fins->op2;
    }
    if (narrow_conv_backprop(&nc, fins->op1, 0) <= 1)
      return narrow_conv_emit(J, &nc);
  }
  return NEXTFOLD;
}